

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::InitDisableInlineApply(FunctionBody *this)

{
  bool bVar1;
  LocalFunctionId LVar2;
  uint uVar3;
  bool local_19;
  FunctionBody *this_local;
  
  LVar2 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  if (LVar2 != 0xffffffff) {
    uVar3 = FunctionProxy::GetSourceContextId((FunctionProxy *)this);
    LVar2 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
    bVar1 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,InlinePhase,uVar3,LVar2);
    local_19 = true;
    if (bVar1) goto LAB_00a13261;
  }
  uVar3 = FunctionProxy::GetSourceContextId((FunctionProxy *)this);
  LVar2 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  local_19 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,InlineApplyPhase,uVar3,LVar2);
LAB_00a13261:
  SetDisableInlineApply(this,local_19);
  return;
}

Assistant:

void FunctionBody::InitDisableInlineApply()
    {
        SetDisableInlineApply(
            (this->GetLocalFunctionId() != Js::Constants::NoFunctionId && PHASE_OFF(Js::InlinePhase, this)) ||
            PHASE_OFF(Js::InlineApplyPhase, this));
    }